

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O1

int __thiscall
CVmObjStringBuffer::getp_splice
          (CVmObjStringBuffer *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  vm_val_t *pvVar1;
  int iVar2;
  int iVar3;
  int del_chars;
  ushort *puVar4;
  vm_val_t strval;
  vm_val_t local_40;
  
  if (getp_splice(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_splice();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_splice::desc);
  if (iVar2 == 0) {
    iVar3 = CVmBif::pop_int_val();
    iVar2 = -1;
    if (iVar3 < 0) {
      iVar2 = *(int *)(this->super_CVmObject).ext_;
    }
    del_chars = CVmBif::pop_int_val();
    puVar4 = (ushort *)vm_val_t::cast_to_string(sp_ + -1,&local_40);
    pvVar1 = sp_;
    pvVar1[-1].typ = local_40.typ;
    *(undefined4 *)&pvVar1[-1].field_0x4 = local_40._4_4_;
    pvVar1[-1].val = local_40.val;
    splice_text(this,self,iVar2 + iVar3,del_chars,(char *)(puVar4 + 1),(uint)*puVar4,1);
    sp_ = sp_ + -1;
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
  }
  return 1;
}

Assistant:

int CVmObjStringBuffer::getp_splice(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(3);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the insertion index and adjust to 0-based or end-based */
    int32_t idx = CVmBif::pop_int_val(vmg0_);
    idx += (idx < 0 ? get_ext()->len : -1);

    /* pop the deletion length */
    int32_t del = CVmBif::pop_int_val(vmg0_);

    /* get or cast the string; leave it on the stack for gc protection */
    vm_val_t strval;
    const char *str = G_stk->get(0)->cast_to_string(vmg_ &strval);
    *G_stk->get(0) = strval;

    /* do the insert */
    splice_text(vmg_ self, idx, del, str + VMB_LEN, vmb_get_len(str), TRUE);

    /* discard gc protection */
    G_stk->discard();

    /* handled */
    retval->set_obj(self);
    return TRUE;
}